

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O2

void __thiscall
sync_tests::inconsistent_lock_order_detected::test_method(inconsistent_lock_order_detected *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Mutex mutex2;
  Mutex mutex1;
  RecursiveMutex rmutex2;
  RecursiveMutex rmutex1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rmutex1.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  rmutex1.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  rmutex1.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  rmutex1.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  rmutex1.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  rmutex2.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  rmutex2.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  rmutex2.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  rmutex2.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  rmutex2.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
            (&rmutex1,&rmutex2);
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
            (&rmutex1,&rmutex2);
  mutex1.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  mutex1.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex1.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutex1.super_mutex.super___mutex_base._M_mutex.__align = 0;
  mutex1.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex2.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex2.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutex2.super_mutex.super___mutex_base._M_mutex.__align = 0;
  mutex2.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex2.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
            (&mutex1,&mutex2);
  (anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
            (&mutex1,&mutex2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(inconsistent_lock_order_detected)
{
#ifdef DEBUG_LOCKORDER
    bool prev = g_debug_lockorder_abort;
    g_debug_lockorder_abort = false;
#endif // DEBUG_LOCKORDER

    RecursiveMutex rmutex1, rmutex2;
    TestInconsistentLockOrderDetected(rmutex1, rmutex2);
    // By checking lock order consistency (CheckLastCritical) before any unlocking (LeaveCritical)
    // the lock tracking data must not have been broken by exception.
    TestInconsistentLockOrderDetected(rmutex1, rmutex2);

    Mutex mutex1, mutex2;
    TestInconsistentLockOrderDetected(mutex1, mutex2);
    // By checking lock order consistency (CheckLastCritical) before any unlocking (LeaveCritical)
    // the lock tracking data must not have been broken by exception.
    TestInconsistentLockOrderDetected(mutex1, mutex2);

#ifdef DEBUG_LOCKORDER
    g_debug_lockorder_abort = prev;
#endif // DEBUG_LOCKORDER
}